

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockFormerVisitor.cpp
# Opt level: O0

void __thiscall
IRT::BlockFormerVisitor::Visit
          (BlockFormerVisitor *this,JumpConditionalStatement *jump_conditional_statement)

{
  LogicOperatorType type;
  JumpConditionalStatement *this_00;
  Label local_98;
  Label local_68;
  undefined1 local_48 [8];
  IRTStorage rhs;
  IRTStorage lhs;
  JumpConditionalStatement *jump_conditional_statement_local;
  BlockFormerVisitor *this_local;
  
  this->block_finished_ = true;
  TemplateVisitor<IRT::IRTStorage>::Accept
            ((IRTStorage *)&rhs.expression_list_,&this->super_TemplateVisitor<IRT::IRTStorage>,
             &jump_conditional_statement->left_operand_->super_BaseElement);
  TemplateVisitor<IRT::IRTStorage>::Accept
            ((IRTStorage *)local_48,&this->super_TemplateVisitor<IRT::IRTStorage>,
             &jump_conditional_statement->right_operand_->super_BaseElement);
  this_00 = (JumpConditionalStatement *)operator_new(0x60);
  type = jump_conditional_statement->operator_type_;
  Label::Label(&local_68,&jump_conditional_statement->label_true_);
  Label::Label(&local_98,&jump_conditional_statement->label_false_);
  JumpConditionalStatement::JumpConditionalStatement
            (this_00,type,(Expression *)rhs.expression_list_,(Expression *)local_48,&local_68,
             &local_98);
  (this->super_TemplateVisitor<IRT::IRTStorage>).tos_value_.statement_ = (Statement *)this_00;
  Label::~Label(&local_98);
  Label::~Label(&local_68);
  return;
}

Assistant:

void BlockFormerVisitor::Visit(
    JumpConditionalStatement* jump_conditional_statement) {
  block_finished_ = true;

  IRTStorage lhs = Accept(jump_conditional_statement->left_operand_);
  IRTStorage rhs = Accept(jump_conditional_statement->right_operand_);

  tos_value_.statement_ = new JumpConditionalStatement(
      jump_conditional_statement->operator_type_, lhs.expression_,
      rhs.expression_, jump_conditional_statement->label_true_,
      jump_conditional_statement->label_false_);
}